

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O1

void aom_hadamard_16x16_avx2(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  uint uVar3;
  long lVar4;
  int16_t *src_ptr;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  int16_t temp_coeff [256];
  int16_t aiStack_260 [64];
  undefined1 auStack_1e0 [128];
  undefined1 auStack_160 [128];
  undefined1 auStack_e0 [176];
  
  lVar4 = 0;
  do {
    aom_hadamard_lp_8x8_dual_avx2(src_diff,src_stride,(int16_t *)((long)aiStack_260 + lVar4));
    src_diff = src_diff + src_stride * 8;
    lVar4 = lVar4 + 0x100;
  } while (lVar4 == 0x100);
  lVar4 = 0;
  do {
    auVar1 = vpaddw_avx2(*(undefined1 (*) [32])(auStack_1e0 + lVar4 * 2),
                         *(undefined1 (*) [32])(aiStack_260 + lVar4));
    auVar5 = vpsubw_avx2(*(undefined1 (*) [32])(aiStack_260 + lVar4),
                         *(undefined1 (*) [32])(auStack_1e0 + lVar4 * 2));
    auVar2 = vpaddw_avx2(*(undefined1 (*) [32])(auStack_e0 + lVar4 * 2),
                         *(undefined1 (*) [32])(auStack_160 + lVar4 * 2));
    auVar7 = vpsubw_avx2(*(undefined1 (*) [32])(auStack_160 + lVar4 * 2),
                         *(undefined1 (*) [32])(auStack_e0 + lVar4 * 2));
    auVar8 = vpsraw_avx2(auVar1,1);
    auVar5 = vpsraw_avx2(auVar5,1);
    auVar6 = vpsraw_avx2(auVar2,1);
    auVar7 = vpsraw_avx2(auVar7,1);
    auVar1 = vpaddw_avx2(auVar6,auVar8);
    auVar9 = vpsraw_avx2(auVar1,0xf);
    auVar2 = vpunpcklwd_avx2(auVar1,auVar9);
    auVar1 = vpunpckhwd_avx2(auVar1,auVar9);
    *(undefined1 (*) [32])(coeff + lVar4) = auVar2;
    *(undefined1 (*) [32])(coeff + lVar4 + 8) = auVar1;
    auVar1 = vpaddw_avx2(auVar7,auVar5);
    auVar9 = vpsraw_avx2(auVar1,0xf);
    auVar2 = vpunpcklwd_avx2(auVar1,auVar9);
    auVar1 = vpunpckhwd_avx2(auVar1,auVar9);
    *(undefined1 (*) [32])(coeff + lVar4 + 0x40) = auVar2;
    *(undefined1 (*) [32])(coeff + lVar4 + 0x48) = auVar1;
    auVar1 = vpsubw_avx2(auVar8,auVar6);
    auVar6 = vpsraw_avx2(auVar1,0xf);
    auVar2 = vpunpcklwd_avx2(auVar1,auVar6);
    auVar1 = vpunpckhwd_avx2(auVar1,auVar6);
    *(undefined1 (*) [32])(coeff + lVar4 + 0x80) = auVar2;
    *(undefined1 (*) [32])(coeff + lVar4 + 0x88) = auVar1;
    auVar1 = vpsubw_avx2(auVar5,auVar7);
    auVar5 = vpsraw_avx2(auVar1,0xf);
    auVar2 = vpunpcklwd_avx2(auVar1,auVar5);
    auVar1 = vpunpckhwd_avx2(auVar1,auVar5);
    *(undefined1 (*) [32])(coeff + lVar4 + 0xc0) = auVar2;
    *(undefined1 (*) [32])(coeff + lVar4 + 200) = auVar1;
    uVar3 = (uint)lVar4;
    lVar4 = lVar4 + 0x10;
  } while (uVar3 < 0x30);
  return;
}

Assistant:

void aom_hadamard_16x16_avx2(const int16_t *src_diff, ptrdiff_t src_stride,
                             tran_low_t *coeff) {
  hadamard_16x16_avx2(src_diff, src_stride, coeff, 1);
}